

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O3

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPointAccelerationError
          (ContactConstraint *this,
          vector<Vector3_t,_std::allocator<Vector3_t>_> *pointAccelerationsSys,VectorNd *ddErrSysUpd
          )

{
  double *pdVar1;
  pointer pVVar2;
  long lVar3;
  pointer pVVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (ulong)(this->super_Constraint).sizeOfConstraint;
  if (uVar7 != 0) {
    lVar3 = *(long *)&(this->super_Constraint).field_0xd8;
    uVar6 = (this->super_Constraint).rowInSystem;
    pVVar4 = (pointAccelerationsSys->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (ddErrSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
             .m_data;
    lVar8 = 0;
    do {
      pdVar1 = (double *)(lVar3 + lVar8);
      pVVar2 = pVVar4 + uVar6;
      pdVar5[uVar6] =
           *(double *)(lVar3 + 0x10 + lVar8) *
           *(double *)
            ((long)&pVVar4[uVar6].super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage + 0x10) +
           *(double *)
            ((long)&(pVVar2->super_Vector3d).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage + 8) *
           pdVar1[1] +
           *(double *)
            &(pVVar2->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage * *pdVar1;
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar7 * 0x18 != lVar8);
  }
  return;
}

Assistant:

void ContactConstraint::
      calcPointAccelerationError(
                    const std::vector<Math::Vector3d> &pointAccelerationsSys,
                    Math::VectorNd &ddErrSysUpd)
{
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    ddErrSysUpd[rowInSystem+i] =
        T[i].dot(pointAccelerationsSys[rowInSystem+i]);
  }
}